

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadPerspectiveCamera(XMLLoader *this,Ref<embree::XML> *xml)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  XML *this_00;
  RefCount *this_01;
  undefined8 *in_RDX;
  Vec3fa up;
  Vec3fa to;
  Vec3fa from;
  string local_80;
  float local_5c;
  undefined1 local_58 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  _func_int **local_38;
  __atomic_base<unsigned_long> _Stack_30;
  
  psVar2 = (string *)*in_RDX;
  paVar1 = &local_80.field_2;
  local_80._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"from","");
  XML::parm_Vec3fa((XML *)&stack0xffffffffffffffc8,psVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  psVar2 = (string *)*in_RDX;
  local_80._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"to","");
  XML::parm_Vec3fa((XML *)(local_58 + 0x10),psVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  psVar2 = (string *)*in_RDX;
  local_80._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"up","");
  XML::parm_Vec3fa((XML *)local_58,psVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  this_00 = (XML *)*in_RDX;
  local_80._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"fov","");
  local_5c = XML::parm_float(this_00,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  this_01 = (RefCount *)alignedMalloc(0xb0,0x10);
  (this_01->refCounter).super___atomic_base<unsigned_long>._M_i = 0;
  this_01[1]._vptr_RefCount = (_func_int **)(this_01 + 2);
  this_01[1].refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined1 *)&this_01[2]._vptr_RefCount = 0;
  this_01[3]._vptr_RefCount = (_func_int **)(this_01 + 4);
  this_01[3].refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined1 *)&this_01[4]._vptr_RefCount = 0;
  this_01[5]._vptr_RefCount = (_func_int **)0x0;
  *(undefined2 *)&this_01[5].refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined4 *)((long)&this_01[5].refCounter.super___atomic_base<unsigned_long>._M_i + 4) =
       0xffffffff;
  this_01[6]._vptr_RefCount = (_func_int **)0x0;
  this_01->_vptr_RefCount = (_func_int **)&PTR__Node_002cb3e0;
  this_01[7]._vptr_RefCount = local_38;
  this_01[7].refCounter.super___atomic_base<unsigned_long>._M_i = _Stack_30._M_i;
  this_01[8]._vptr_RefCount = (_func_int **)local_58._16_8_;
  this_01[8].refCounter.super___atomic_base<unsigned_long>._M_i = (__int_type)_Stack_40._M_pi;
  this_01[9]._vptr_RefCount = (_func_int **)local_58._0_8_;
  this_01[9].refCounter.super___atomic_base<unsigned_long>._M_i = local_58._8_8_;
  *(float *)&this_01[10]._vptr_RefCount = local_5c;
  (this->path).filename._M_dataplus._M_p = (pointer)this_01;
  RefCount::refInc(this_01);
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadPerspectiveCamera(const Ref<XML>& xml) 
  {
    const Vec3fa from = xml->parm_Vec3fa("from");
    const Vec3fa to = xml->parm_Vec3fa("to");
    const Vec3fa up = xml->parm_Vec3fa("up");
    const float fov = xml->parm_float("fov");
    return new SceneGraph::PerspectiveCameraNode(from,to,up,fov);
  }